

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O0

void test_open_address_hashmap_update_2(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  char *pcVar3;
  bool bVar4;
  char local_b2 [8];
  char str_3 [10];
  ion_value_t value_1;
  char local_8c [8];
  char str_2 [10];
  char str_1 [10];
  ion_value_t value;
  char local_5e [8];
  char str [10];
  ion_status_t status;
  int i;
  ion_hashmap_t map;
  planck_unit_test_t *tc_local;
  
  initialize_hash_map_std_conditions((ion_hashmap_t *)&status.count);
  pVar1 = planck_unit_assert_true
                    (tc,1,0x2bd,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  status.error = '\0';
  status._1_3_ = 0;
  while( true ) {
    if ((int)map.super.id / 2 <= (int)status._0_4_) {
      status.error = '\0';
      status._1_3_ = 0;
      while( true ) {
        if ((int)map.super.id / 2 <= (int)status._0_4_) {
          status.error = '\0';
          status._1_3_ = 0;
          while( true ) {
            if ((int)map.super.id <= (int)status._0_4_) {
              status.error = '\0';
              status._1_3_ = 0;
              while( true ) {
                if ((int)map.super.id <= (int)status._0_4_) {
                  iVar2 = oah_destroy((ion_hashmap_t *)&status.count);
                  pVar1 = planck_unit_assert_true
                                    (tc,(uint)(iVar2 == '\0'),0x2fe,
                                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                     ,"condition was false, expected true");
                  if (pVar1 == '\0') {
                    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
                  }
                  return;
                }
                pcVar3 = (char *)malloc(10);
                str_3._2_8_ = oah_get((ion_hashmap_t *)&status.count,&status,pcVar3);
                str[2] = (char)str_3._2_8_;
                bVar4 = str[2] == '\0';
                str._2_8_ = str_3._2_8_;
                pVar1 = planck_unit_assert_true
                                  (tc,(uint)bVar4,0x2f0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                   ,"condition was false, expected true");
                if (pVar1 == '\0') {
                  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
                }
                pVar1 = planck_unit_assert_true
                                  (tc,(uint)(str._6_4_ == 1),0x2f1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                   ,"condition was false, expected true");
                if (pVar1 == '\0') {
                  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
                }
                sprintf(local_b2,"%02i is new",(ulong)(uint)status._0_4_);
                pVar1 = planck_unit_assert_str_are_equal
                                  (tc,pcVar3,local_b2,0x2f7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                  );
                if (pVar1 == '\0') break;
                if (pcVar3 != (char *)0x0) {
                  free(pcVar3);
                }
                status._0_4_ = status._0_4_ + 1;
              }
              longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
            }
            sprintf(local_8c,"%02i is new",(ulong)(uint)status._0_4_);
            str._2_8_ = oah_update((ion_hashmap_t *)&status.count,&status,local_8c);
            pVar1 = planck_unit_assert_true
                              (tc,(uint)(str[2] == '\0'),0x2e6,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                               ,"condition was false, expected true");
            if (pVar1 == '\0') {
              longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
            }
            pVar1 = planck_unit_assert_true
                              (tc,(uint)(str._6_4_ == 1),0x2e7,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                               ,"condition was false, expected true");
            if (pVar1 == '\0') break;
            status._0_4_ = status._0_4_ + 1;
          }
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        pcVar3 = (char *)malloc(10);
        str._2_8_ = oah_get((ion_hashmap_t *)&status.count,&status,pcVar3);
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(str[2] == '\0'),0x2d0,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(str._6_4_ == 1),0x2d1,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') break;
        sprintf(str_2 + 2,"%02i is key",(ulong)(uint)status._0_4_);
        pVar1 = planck_unit_assert_str_are_equal
                          (tc,pcVar3,str_2 + 2,0x2d7,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                          );
        if (pVar1 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        if (pcVar3 != (char *)0x0) {
          free(pcVar3);
        }
        status._0_4_ = status._0_4_ + 1;
      }
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    sprintf(local_5e,"%02i is key",(ulong)(uint)status._0_4_);
    str._2_8_ = oah_insert((ion_hashmap_t *)&status.count,&status,local_5e);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(str[2] == '\0'),0x2c6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(str._6_4_ == 1),0x2c7,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    status._0_4_ = status._0_4_ + 1;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_update_2(
	planck_unit_test_t *tc
) {
	ion_hashmap_t	map;							/* create handler for hashmap */
	int				i;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	/* change write concern to allow up updates */
	map.write_concern = wc_insert_unique;

	/* check to make sure that the write concern is set to wc_insert_unique (default) */
	PLANCK_UNIT_ASSERT_TRUE(tc, wc_insert_unique == map.write_concern);

	/* populate the map to only half capacity to make sure there is room */
	for (i = 0; i < (map.map_size / 2); i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is key", i);
		status = oah_insert(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	/* check status of <K,V> */
	for (i = 0; i < map.map_size / 2; i++) {
		ion_value_t value;

		value	= malloc(10);
		status	= oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is key", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);

		if (value != NULL) {
			/* must free value after query */
			free(value);
		}
	}

	/*and update the values for the known keys */
	for (i = 0; i < (map.map_size); i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is new", i);
		status = oah_update(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	/* and check updated status of <K,V> */
	for (i = 0; i < map.map_size; i++) {
		ion_value_t value;

		value	= malloc(10);
		status	= oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is new", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);

		if (value != NULL) {
			free(value);
		}	/* must free value after query */
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}